

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

u32 sqlite3FkOldmask(Parse *pParse,Table *pTab)

{
  long in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  Index **unaff_retaddr;
  FKey *in_stack_00000008;
  Table *in_stack_00000010;
  int i;
  FKey *p;
  u32 mask;
  Index *pIdx;
  uint local_38;
  int local_34;
  FKey *local_30;
  u32 local_24;
  int **paiCol;
  
  paiCol = *(int ***)(in_FS_OFFSET + 0x28);
  local_24 = 0;
  if (((*(ulong *)(*in_RDI + 0x30) & 0x4000) != 0) && (*(char *)(in_RSI + 0x3f) == '\0')) {
    for (local_30 = *(FKey **)(in_RSI + 0x48); local_30 != (FKey *)0x0;
        local_30 = *(FKey **)((long)local_30 + 8)) {
      for (local_34 = 0; local_34 < *(int *)((long)local_30 + 0x28); local_34 = local_34 + 1) {
        if (*(int *)((long)local_30 + 0x40 + (long)local_34 * 0x10) < 0x20) {
          local_38 = 1 << ((byte)*(undefined4 *)((long)local_30 + 0x40 + (long)local_34 * 0x10) &
                          0x1f);
        }
        else {
          local_38 = 0xffffffff;
        }
        local_24 = local_38 | local_24;
      }
    }
    for (local_30 = sqlite3FkReferences((Table *)0x213828); local_30 != (FKey *)0x0;
        local_30 = local_30->pNextTo) {
      sqlite3FkLocateIndex((Parse *)p,in_stack_00000010,in_stack_00000008,unaff_retaddr,paiCol);
    }
  }
  if (*(int ***)(in_FS_OFFSET + 0x28) == paiCol) {
    return local_24;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE u32 sqlite3FkOldmask(
  Parse *pParse,                  /* Parse context */
  Table *pTab                     /* Table being modified */
){
  u32 mask = 0;
  if( pParse->db->flags&SQLITE_ForeignKeys && IsOrdinaryTable(pTab) ){
    FKey *p;
    int i;
    for(p=pTab->u.tab.pFKey; p; p=p->pNextFrom){
      for(i=0; i<p->nCol; i++) mask |= COLUMN_MASK(p->aCol[i].iFrom);
    }
    for(p=sqlite3FkReferences(pTab); p; p=p->pNextTo){
      Index *pIdx = 0;
      sqlite3FkLocateIndex(pParse, pTab, p, &pIdx, 0);
      if( pIdx ){
        for(i=0; i<pIdx->nKeyCol; i++){
          assert( pIdx->aiColumn[i]>=0 );
          mask |= COLUMN_MASK(pIdx->aiColumn[i]);
        }
      }
    }
  }
  return mask;
}